

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

MidiFile * __thiscall smf::MidiFile::operator=(MidiFile *this,MidiFile *other)

{
  pointer ppMVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  MidiEventList *this_00;
  MidiEventList *local_20;
  
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::_M_move_assign();
  this->m_linkedEventsQ = other->m_linkedEventsQ;
  other->m_linkedEventsQ = false;
  ppMVar1 = (other->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((other->m_events).
      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppMVar1) {
    (other->m_events).
    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppMVar1;
  }
  this_00 = (MidiEventList *)operator_new(0x18);
  MidiEventList::MidiEventList(this_00);
  local_20 = this_00;
  std::vector<smf::MidiEventList*,std::allocator<smf::MidiEventList*>>::
  emplace_back<smf::MidiEventList*>
            ((vector<smf::MidiEventList*,std::allocator<smf::MidiEventList*>> *)other,&local_20);
  iVar2 = other->m_trackCount;
  iVar3 = other->m_theTrackState;
  iVar4 = other->m_theTimeState;
  this->m_ticksPerQuarterNote = other->m_ticksPerQuarterNote;
  this->m_trackCount = iVar2;
  this->m_theTrackState = iVar3;
  this->m_theTimeState = iVar4;
  std::__cxx11::string::_M_assign((string *)&this->m_readFileName);
  this->m_timemapvalid = other->m_timemapvalid;
  std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator=
            (&this->m_timemap,&other->m_timemap);
  this->m_rwstatus = other->m_rwstatus;
  return this;
}

Assistant:

MidiFile& MidiFile::operator=(MidiFile&& other) {
	m_events = std::move(other.m_events);
	m_linkedEventsQ = other.m_linkedEventsQ;
	other.m_linkedEventsQ = false;
	other.m_events.clear();
	other.m_events.emplace_back(new MidiEventList);
	m_ticksPerQuarterNote = other.m_ticksPerQuarterNote;
	m_trackCount          = other.m_trackCount;
	m_theTrackState       = other.m_theTrackState;
	m_theTimeState        = other.m_theTimeState;
	m_readFileName        = other.m_readFileName;
	m_timemapvalid        = other.m_timemapvalid;
	m_timemap             = other.m_timemap;
	m_rwstatus            = other.m_rwstatus;
	return *this;
}